

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

void set_lz_options(lzma_lz_options_conflict *lz_options,lzma_options_lzma *options)

{
  uint32_t uVar1;
  
  lz_options->before_size = 0x1000;
  lz_options->dict_size = (ulong)options->dict_size;
  lz_options->after_size = 0x1001;
  lz_options->match_len_max = 0x111;
  lz_options->nice_len = (ulong)options->nice_len;
  uVar1 = options->depth;
  lz_options->match_finder = options->mf;
  lz_options->depth = uVar1;
  lz_options->preset_dict = options->preset_dict;
  lz_options->preset_dict_size = options->preset_dict_size;
  return;
}

Assistant:

static void
set_lz_options(lzma_lz_options *lz_options, const lzma_options_lzma *options)
{
	// LZ encoder initialization does the validation for these so we
	// don't need to validate here.
	lz_options->before_size = OPTS;
	lz_options->dict_size = options->dict_size;
	lz_options->after_size = LOOP_INPUT_MAX;
	lz_options->match_len_max = MATCH_LEN_MAX;
	lz_options->nice_len = options->nice_len;
	lz_options->match_finder = options->mf;
	lz_options->depth = options->depth;
	lz_options->preset_dict = options->preset_dict;
	lz_options->preset_dict_size = options->preset_dict_size;
	return;
}